

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O1

ArrayPtr<const_capnp::word> __thiscall
capnp::FlatArrayMessageReader::checkAlignment
          (FlatArrayMessageReader *this,ArrayPtr<const_capnp::word> array)

{
  ArrayPtr<const_capnp::word> AVar1;
  Fault f;
  Fault local_10;
  
  if (((ulong)this & 7) == 0) {
    AVar1.size_ = (size_t)array.ptr;
    AVar1.ptr = (word *)this;
    return AVar1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[209]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0x73,FAILED,"(uintptr_t)array.begin() % sizeof(void*) == 0",
             "\"Input to FlatArrayMessageReader is not aligned. If your architecture supports unaligned \" \"access (e.g. x86/x64/modern ARM), you may use UnalignedFlatArrayMessageReader instead, \" \"though this may harm performance.\""
             ,(char (*) [209])
              "Input to FlatArrayMessageReader is not aligned. If your architecture supports unaligned access (e.g. x86/x64/modern ARM), you may use UnalignedFlatArrayMessageReader instead, though this may harm performance."
            );
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

kj::ArrayPtr<const word> FlatArrayMessageReader::checkAlignment(kj::ArrayPtr<const word> array) {
  KJ_REQUIRE((uintptr_t)array.begin() % sizeof(void*) == 0,
      "Input to FlatArrayMessageReader is not aligned. If your architecture supports unaligned "
      "access (e.g. x86/x64/modern ARM), you may use UnalignedFlatArrayMessageReader instead, "
      "though this may harm performance.");

  return array;
}